

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGhsMultiGenerator::Generate(cmGlobalGhsMultiGenerator *this)

{
  _Base_ptr p_Var1;
  string *psVar2;
  cmGlobalGhsMultiGenerator *pcVar3;
  string fname;
  cmGeneratedFileStream ftarget;
  cmGeneratedFileStream frule;
  
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  cmGlobalGenerator::Generate(&this->super_cmGlobalGenerator);
  for (p_Var1 = (this->super_cmGlobalGenerator).ProjectMap._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->super_cmGlobalGenerator).ProjectMap._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    OutputTopLevelProject
              (this,(cmLocalGenerator *)**(undefined8 **)(p_Var1 + 2),
               (vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)(p_Var1 + 2));
  }
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_((this->super_cmGlobalGenerator).CMakeInstance);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&frule,psVar2,
                 "/CMakeFiles/custom_rule.bod");
  std::__cxx11::string::operator=((string *)&fname,(string *)&frule);
  std::__cxx11::string::~string((string *)&frule);
  cmGeneratedFileStream::cmGeneratedFileStream(&frule,&fname,false,None);
  pcVar3 = (cmGlobalGhsMultiGenerator *)&frule;
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)pcVar3,true);
  WriteFileHeader(pcVar3,(ostream *)&frule);
  std::operator<<((ostream *)&frule,
                  "Commands {\n  Custom_Rule_Command {\n    name = \"Custom Rule Command\"\n    exec = \"/bin/sh\"\n    options = {\"SpecialOptions\"}\n  }\n}\n\n\nFileTypes {\n  CmakeRule {\n    name = \"Custom Rule\"\n    action = \"&Run\"\n    extensions = {\"sh\"}\n    grepable = false\n    command = \"Custom Rule Command\"\n    commandLine = \"$COMMAND  $INPUTFILE\"\n    progress = \"Processing Custom Rule\"\n    promoteToFirstPass = true\n    outputType = \"None\"\n    color = \"#800080\"\n  }\n}\n"
                 );
  cmGeneratedFileStream::Close(&frule);
  psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_((this->super_cmGlobalGenerator).CMakeInstance);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ftarget,
                 psVar2,"/CMakeFiles/custom_target.bod");
  std::__cxx11::string::operator=((string *)&fname,(string *)&ftarget);
  std::__cxx11::string::~string((string *)&ftarget);
  cmGeneratedFileStream::cmGeneratedFileStream(&ftarget,&fname,false,None);
  pcVar3 = (cmGlobalGhsMultiGenerator *)&ftarget;
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)pcVar3,true);
  WriteFileHeader(pcVar3,(ostream *)&ftarget);
  std::operator<<((ostream *)&ftarget,
                  "FileTypes {\n  CmakeTarget {\n    name = \"Custom Target\"\n    action = \"&Execute\"\n    grepable = false\n    outputType = \"None\"\n    color = \"#800080\"\n  }\n}\n"
                 );
  cmGeneratedFileStream::Close(&ftarget);
  cmGeneratedFileStream::~cmGeneratedFileStream(&ftarget);
  cmGeneratedFileStream::~cmGeneratedFileStream(&frule);
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::Generate()
{
  std::string fname;

  // first do the superclass method
  this->cmGlobalGenerator::Generate();

  // output top-level projects
  for (auto& it : this->ProjectMap) {
    this->OutputTopLevelProject(it.second[0], it.second);
  }

  // create custom rule BOD file
  fname = this->GetCMakeInstance()->GetHomeOutputDirectory() +
    "/CMakeFiles/custom_rule.bod";
  cmGeneratedFileStream frule(fname);
  frule.SetCopyIfDifferent(true);
  this->WriteFileHeader(frule);
  this->WriteCustomRuleBOD(frule);
  frule.Close();

  // create custom target BOD file
  fname = this->GetCMakeInstance()->GetHomeOutputDirectory() +
    "/CMakeFiles/custom_target.bod";
  cmGeneratedFileStream ftarget(fname);
  ftarget.SetCopyIfDifferent(true);
  this->WriteFileHeader(ftarget);
  this->WriteCustomTargetBOD(ftarget);
  ftarget.Close();
}